

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token * __thiscall inja::Lexer::scan(Token *__return_storage_ptr__,Lexer *this)

{
  string_view *this_00;
  LexerConfig *pLVar1;
  string_view close_trim;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  size_type __pos;
  size_t sVar5;
  size_type sVar6;
  char *pcVar7;
  char cVar8;
  Kind KVar9;
  size_t in_R8;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  string_view sVar11;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  string_view prefix_03;
  string_view prefix_04;
  string_view prefix_05;
  string_view prefix_06;
  string_view close;
  string_view text;
  char *pcVar12;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  size_t local_68;
  char *pcStack_60;
  size_t local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar3 = this->pos;
  this->tok_start = uVar3;
  this_00 = &this->m_in;
LAB_001494d8:
  if (this_00->_M_len <= uVar3) {
LAB_00149950:
    KVar9 = Eof;
LAB_00149959:
    make_token(__return_storage_ptr__,this,KVar9);
    return __return_storage_ptr__;
  }
  switch(this->state) {
  case ExpressionStart:
    this->state = ExpressionBody;
    sVar6 = (this->config->expression_open)._M_string_length;
    goto LAB_00149894;
  case ExpressionStartForceLstrip:
    this->state = ExpressionBody;
    sVar6 = (this->config->expression_open_force_lstrip)._M_string_length;
LAB_00149894:
    this->pos = this->pos + sVar6;
    KVar9 = ExpressionOpen;
    goto LAB_00149959;
  case ExpressionBody:
    pLVar1 = this->config;
    pcVar7 = (pLVar1->expression_close)._M_dataplus._M_p;
    sVar6 = (pLVar1->expression_close)._M_string_length;
    pcVar12 = (pLVar1->expression_close_force_rstrip)._M_dataplus._M_p;
    sVar5 = (pLVar1->expression_close_force_rstrip)._M_string_length;
    KVar9 = ExpressionClose;
    local_58 = sVar5;
    pcStack_50 = pcVar12;
    goto LAB_00149844;
  case LineStart:
    this->state = LineBody;
    this->pos = this->pos + (this->config->line_statement)._M_string_length;
    KVar9 = LineStatementOpen;
    goto LAB_00149959;
  case LineBody:
    local_48 = 0;
    uStack_40 = 0;
    sVar5 = 0;
    pcVar12 = (char *)0x0;
    pcVar7 = "\n";
    sVar6 = 1;
    KVar9 = LineStatementClose;
LAB_00149844:
    bVar2 = false;
LAB_00149922:
    close_trim._M_str = pcVar12;
    close_trim._M_len = sVar5;
    close._M_str = pcVar7;
    close._M_len = sVar6;
    scan_body(__return_storage_ptr__,this,close,KVar9,close_trim,bVar2);
    return __return_storage_ptr__;
  case StatementStart:
    this->state = StatementBody;
    sVar6 = (this->config->statement_open)._M_string_length;
    break;
  case StatementStartNoLstrip:
    this->state = StatementBody;
    sVar6 = (this->config->statement_open_no_lstrip)._M_string_length;
    break;
  case StatementStartForceLstrip:
    this->state = StatementBody;
    sVar6 = (this->config->statement_open_force_lstrip)._M_string_length;
    break;
  case StatementBody:
    pLVar1 = this->config;
    pcVar7 = (pLVar1->statement_close)._M_dataplus._M_p;
    sVar6 = (pLVar1->statement_close)._M_string_length;
    pcVar12 = (pLVar1->statement_close_force_rstrip)._M_dataplus._M_p;
    sVar5 = (pLVar1->statement_close_force_rstrip)._M_string_length;
    bVar2 = pLVar1->trim_blocks;
    KVar9 = StatementClose;
    local_68 = sVar5;
    pcStack_60 = pcVar12;
    goto LAB_00149922;
  case CommentStart:
    this->state = CommentBody;
    sVar6 = (this->config->comment_open)._M_string_length;
    goto LAB_001498dc;
  case CommentStartForceLstrip:
    this->state = CommentBody;
    sVar6 = (this->config->comment_open_force_lstrip)._M_string_length;
LAB_001498dc:
    this->pos = this->pos + sVar6;
    KVar9 = CommentOpen;
    goto LAB_00149959;
  case CommentBody:
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,this->pos,0xffffffffffffffff);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      (&local_78,(this->config->comment_close)._M_dataplus._M_p,0,
                       (this->config->comment_close)._M_string_length);
    if (sVar4 != 0xffffffffffffffff) {
      bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,(sVar4 + this->pos) - 1,0xffffffffffffffff);
      prefix_06._M_str = (this->config->comment_close_force_rstrip)._M_dataplus._M_p;
      prefix_06._M_len = (this->config->comment_close_force_rstrip)._M_string_length;
      bVar2 = string_view::starts_with(bVar10,prefix_06);
      this->state = Text;
      this->pos = this->pos + (this->config->comment_close)._M_string_length + sVar4;
      make_token(__return_storage_ptr__,this,CommentClose);
      if ((!bVar2) && (this->config->trim_blocks != true)) {
        return __return_storage_ptr__;
      }
      skip_whitespaces_and_first_newline(this);
      return __return_storage_ptr__;
    }
    this->pos = (this->m_in)._M_len;
    goto LAB_00149950;
  default:
    local_78 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (this_00,this->pos,0xffffffffffffffff);
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_78,(this->config->open_chars)._M_dataplus._M_p,0,
                       (this->config->open_chars)._M_string_length);
    if (sVar4 == 0xffffffffffffffff) {
      this->pos = (this->m_in)._M_len;
      KVar9 = Text;
      goto LAB_00149959;
    }
    __pos = sVar4 + this->pos;
    this->pos = __pos;
    bVar10 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (this_00,__pos,0xffffffffffffffff);
    sVar11._M_str = (this->config->expression_open)._M_dataplus._M_p;
    sVar11._M_len = (this->config->expression_open)._M_string_length;
    bVar2 = string_view::starts_with(bVar10,sVar11);
    pLVar1 = this->config;
    if (bVar2) {
      prefix._M_str = (pLVar1->expression_open_force_lstrip)._M_dataplus._M_p;
      prefix._M_len = (pLVar1->expression_open_force_lstrip)._M_string_length;
      bVar2 = string_view::starts_with(bVar10,prefix);
      if (bVar2) {
        this->state = ExpressionStartForceLstrip;
LAB_00149594:
        cVar8 = '\x01';
      }
      else {
        this->state = ExpressionStart;
LAB_001495de:
        cVar8 = '\0';
      }
LAB_001496b7:
      sVar11 = string_view::slice((string_view *)(this->m_in)._M_len,
                                  *(string_view *)&(this->m_in)._M_str,this->pos,in_R8);
      text._M_str = sVar11._M_str;
      if (cVar8 != '\0') {
        text._M_len = (size_t)text._M_str;
        sVar11 = clear_final_line_if_whitespace((Lexer *)sVar11._M_len,text);
      }
      if (sVar11._M_len != 0) {
        __return_storage_ptr__->kind = Text;
        __return_storage_ptr__->text = sVar11;
        return __return_storage_ptr__;
      }
    }
    else {
      prefix_00._M_str = (pLVar1->statement_open)._M_dataplus._M_p;
      prefix_00._M_len = (pLVar1->statement_open)._M_string_length;
      bVar2 = string_view::starts_with(bVar10,prefix_00);
      pLVar1 = this->config;
      if (bVar2) {
        prefix_01._M_str = (pLVar1->statement_open_no_lstrip)._M_dataplus._M_p;
        prefix_01._M_len = (pLVar1->statement_open_no_lstrip)._M_string_length;
        bVar2 = string_view::starts_with(bVar10,prefix_01);
        if (bVar2) {
          this->state = StatementStartNoLstrip;
          goto LAB_001495de;
        }
        prefix_04._M_str = (this->config->statement_open_force_lstrip)._M_dataplus._M_p;
        prefix_04._M_len = (this->config->statement_open_force_lstrip)._M_string_length;
        bVar2 = string_view::starts_with(bVar10,prefix_04);
        if (!bVar2) {
          this->state = StatementStart;
          goto LAB_001496ad;
        }
        this->state = StatementStartForceLstrip;
        goto LAB_00149594;
      }
      prefix_02._M_str = (pLVar1->comment_open)._M_dataplus._M_p;
      prefix_02._M_len = (pLVar1->comment_open)._M_string_length;
      bVar2 = string_view::starts_with(bVar10,prefix_02);
      if (bVar2) {
        prefix_03._M_str = (this->config->comment_open_force_lstrip)._M_dataplus._M_p;
        prefix_03._M_len = (this->config->comment_open_force_lstrip)._M_string_length;
        bVar2 = string_view::starts_with(bVar10,prefix_03);
        if (bVar2) {
          this->state = CommentStartForceLstrip;
          goto LAB_00149594;
        }
        this->state = CommentStart;
LAB_001496ad:
        cVar8 = this->config->lstrip_blocks;
        goto LAB_001496b7;
      }
      sVar5 = this->pos;
      if ((sVar5 == 0) || ((this->m_in)._M_str[sVar5 - 1] == '\n')) {
        prefix_05._M_str = (this->config->line_statement)._M_dataplus._M_p;
        prefix_05._M_len = (this->config->line_statement)._M_string_length;
        bVar2 = string_view::starts_with(bVar10,prefix_05);
        if (bVar2) {
          this->state = LineStart;
          goto LAB_001495de;
        }
        sVar5 = this->pos;
      }
      this->pos = sVar5 + 1;
    }
    uVar3 = this->tok_start;
    goto LAB_001494d8;
  }
  this->pos = this->pos + sVar6;
  KVar9 = StatementOpen;
  goto LAB_00149959;
}

Assistant:

Token scan() {
    tok_start = pos;

  again:
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }

    switch (state) {
    default:
    case State::Text: {
      // fast-scan to first open character
      const size_t open_start = m_in.substr(pos).find_first_of(config.open_chars);
      if (open_start == std::string_view::npos) {
        // didn't find open, return remaining text as text token
        pos = m_in.size();
        return make_token(Token::Kind::Text);
      }
      pos += open_start;

      // try to match one of the opening sequences, and get the close
      const std::string_view open_str = m_in.substr(pos);
      bool must_lstrip = false;
      if (inja::string_view::starts_with(open_str, config.expression_open)) {
        if (inja::string_view::starts_with(open_str, config.expression_open_force_lstrip)) {
          state = State::ExpressionStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::ExpressionStart;
        }
      } else if (inja::string_view::starts_with(open_str, config.statement_open)) {
        if (inja::string_view::starts_with(open_str, config.statement_open_no_lstrip)) {
          state = State::StatementStartNoLstrip;
        } else if (inja::string_view::starts_with(open_str, config.statement_open_force_lstrip)) {
          state = State::StatementStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::StatementStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if (inja::string_view::starts_with(open_str, config.comment_open)) {
        if (inja::string_view::starts_with(open_str, config.comment_open_force_lstrip)) {
          state = State::CommentStartForceLstrip;
          must_lstrip = true;
        } else {
          state = State::CommentStart;
          must_lstrip = config.lstrip_blocks;
        }
      } else if ((pos == 0 || m_in[pos - 1] == '\n') && inja::string_view::starts_with(open_str, config.line_statement)) {
        state = State::LineStart;
      } else {
        pos += 1; // wasn't actually an opening sequence
        goto again;
      }

      std::string_view text = string_view::slice(m_in, tok_start, pos);
      if (must_lstrip) {
        text = clear_final_line_if_whitespace(text);
      }

      if (text.empty()) {
        goto again; // don't generate empty token
      }
      return Token(Token::Kind::Text, text);
    }
    case State::ExpressionStart: {
      state = State::ExpressionBody;
      pos += config.expression_open.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::ExpressionStartForceLstrip: {
      state = State::ExpressionBody;
      pos += config.expression_open_force_lstrip.size();
      return make_token(Token::Kind::ExpressionOpen);
    }
    case State::LineStart: {
      state = State::LineBody;
      pos += config.line_statement.size();
      return make_token(Token::Kind::LineStatementOpen);
    }
    case State::StatementStart: {
      state = State::StatementBody;
      pos += config.statement_open.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartNoLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_no_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::StatementStartForceLstrip: {
      state = State::StatementBody;
      pos += config.statement_open_force_lstrip.size();
      return make_token(Token::Kind::StatementOpen);
    }
    case State::CommentStart: {
      state = State::CommentBody;
      pos += config.comment_open.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::CommentStartForceLstrip: {
      state = State::CommentBody;
      pos += config.comment_open_force_lstrip.size();
      return make_token(Token::Kind::CommentOpen);
    }
    case State::ExpressionBody:
      return scan_body(config.expression_close, Token::Kind::ExpressionClose, config.expression_close_force_rstrip);
    case State::LineBody:
      return scan_body("\n", Token::Kind::LineStatementClose);
    case State::StatementBody:
      return scan_body(config.statement_close, Token::Kind::StatementClose, config.statement_close_force_rstrip, config.trim_blocks);
    case State::CommentBody: {
      // fast-scan to comment close
      const size_t end = m_in.substr(pos).find(config.comment_close);
      if (end == std::string_view::npos) {
        pos = m_in.size();
        return make_token(Token::Kind::Eof);
      }

      // Check for trim pattern
      const bool must_rstrip = inja::string_view::starts_with(m_in.substr(pos + end - 1), config.comment_close_force_rstrip);

      // return the entire comment in the close token
      state = State::Text;
      pos += end + config.comment_close.size();
      Token tok = make_token(Token::Kind::CommentClose);

      if (must_rstrip || config.trim_blocks) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }
    }
  }